

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::
default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
::default_disp_impl_t
          (default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
           *this,outliving_reference_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
                 *event_queue,
          outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
          *activity_tracker)

{
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>_>
  local_20;
  outliving_reference_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  local_18;
  
  local_18 = (outliving_reference_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
              )event_queue->m_ptr;
  default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  ::default_disp_impl_basis_t
            (&this->
              super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
             ,&local_18);
  (this->
  super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  ).super_dispatcher_t._vptr_dispatcher_t = (_func_int **)&PTR__default_disp_impl_t_002c91b8;
  local_20.m_ptr = this;
  disp_data_source_t::disp_data_source_t(&this->m_data_source,&local_20);
  (this->m_activity_tracker).m_ptr = activity_tracker->m_ptr;
  return;
}

Assistant:

default_disp_impl_t(
			outliving_reference_t< EVENT_QUEUE_TYPE > event_queue,
			outliving_reference_t< ACTIVITY_TRACKER > activity_tracker )
			:	default_disp_impl_basis_t< EVENT_QUEUE_TYPE >( std::move(event_queue) )
			,	m_data_source( outliving_mutable( *this ) )
			,	m_activity_tracker( std::move(activity_tracker) )
			{}